

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O0

void Am_Rich_Text_Initialize(void)

{
  unsigned_short uVar1;
  Am_Object *pAVar2;
  Am_Method_Wrapper *value;
  Am_Wrapper *pAVar3;
  Am_Text_Viewing_Context local_68;
  ushort local_5a;
  Am_Slot AStack_58;
  unsigned_short mask;
  Am_Slot_Data *local_50;
  unsigned_short local_42;
  Am_Slot AStack_40;
  unsigned_short prev_bits;
  Am_Slot slot;
  Am_Demon_Set local_30;
  Am_Demon_Set demons;
  Am_Object_Advanced obj_adv_viewer;
  Am_Object local_10;
  
  Am_Object::Create(&local_10,(char *)&Am_Graphical_Object);
  Am_Object::operator=(&Am_Text_Viewer,&local_10);
  Am_Object::~Am_Object(&local_10);
  Am_Object_Advanced::Am_Object_Advanced
            ((Am_Object_Advanced *)&demons,(Am_Object_Advanced *)&Am_Text_Viewer);
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&slot);
  Am_Demon_Set::Copy(&local_30);
  Am_Demon_Set::~Am_Demon_Set((Am_Demon_Set *)&slot);
  Am_Demon_Set::Set_Slot_Demon(&local_30,2,rich_text_demon,4);
  Am_Object_Advanced::Set_Demons((Am_Object_Advanced *)&demons,&local_30);
  Am_Slot::Am_Slot(&stack0xffffffffffffffc0);
  local_50 = (Am_Slot_Data *)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&demons,0x66);
  AStack_40 = (Am_Slot)local_50;
  local_42 = Am_Slot::Get_Demon_Bits(&stack0xffffffffffffffc0);
  Am_Slot::Set_Demon_Bits(&stack0xffffffffffffffc0,local_42 | 2);
  AStack_58 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&demons,0xab);
  AStack_40 = AStack_58;
  local_42 = Am_Slot::Get_Demon_Bits(&stack0xffffffffffffffc0);
  Am_Slot::Set_Demon_Bits(&stack0xffffffffffffffc0,local_42 | 2);
  uVar1 = Am_Object_Advanced::Get_Demon_Mask((Am_Object_Advanced *)&demons);
  local_5a = uVar1 | 2;
  Am_Object_Advanced::Set_Demon_Mask((Am_Object_Advanced *)&demons,local_5a);
  pAVar2 = Am_Object::Set(&Am_Text_Viewer,0x65,0,0);
  pAVar2 = Am_Object::Set(pAVar2,100,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x66,200,0);
  pAVar2 = Am_Object::Set(pAVar2,0x67,200,0);
  value = Am_Draw_Method::operator_cast_to_Am_Method_Wrapper_(&draw_rich_text);
  pAVar2 = Am_Object::Set(pAVar2,2000,value,0);
  pAVar3 = Am_Rich_Text::operator_cast_to_Am_Wrapper_(&Am_No_Rich_Text);
  pAVar2 = Am_Object::Add(pAVar2,0xab,pAVar3,0);
  Am_Text_Viewing_Context::Am_Text_Viewing_Context(&local_68);
  pAVar3 = Am_Text_Viewing_Context::operator_cast_to_Am_Wrapper_(&local_68);
  Am_Object::Add(pAVar2,0x1ee,pAVar3,0);
  Am_Text_Viewing_Context::~Am_Text_Viewing_Context(&local_68);
  Am_Demon_Set::~Am_Demon_Set(&local_30);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&demons);
  return;
}

Assistant:

void
Am_Rich_Text_Initialize()
{
#ifdef DEBUG
  Am_Register_Slot_Key(Am_TEXT_VIEWER, "~TEXT_VIEWER~");
#endif

  Am_Text_Viewer = Am_Graphical_Object.Create(DSTR("Rich_Text_Viewer"));

  // Installing the demon procedure Rich_text_demon for Am_TEXT and Am_WIDTH

  // Get the advanced object of Am_Text_Viewer
  Am_Object_Advanced obj_adv_viewer = (Am_Object_Advanced &)Am_Text_Viewer;

  // Make a copy of the inherited demon set.
  Am_Demon_Set demons(obj_adv_viewer.Get_Demons().Copy());

  // Add the Rich_text_demon to the demon set using Rich_text_demon_bit
  demons.Set_Slot_Demon(rich_text_demon_bit, rich_text_demon,
                        Am_DEMON_ON_CHANGE | Am_DEMON_PER_SLOT);

  // Put the modified demon set back into the Am_Text_Viewer
  obj_adv_viewer.Set_Demons(demons);

  // Add the Rich_text_demon_bit to the demon bits of the
  // Am_WIDTH and Am_TEXT slots
  Am_Slot slot;
  unsigned short prev_bits;

  slot = obj_adv_viewer.Get_Slot(Am_WIDTH);
  prev_bits = slot.Get_Demon_Bits();
  slot.Set_Demon_Bits(rich_text_demon_bit | prev_bits);

  slot = obj_adv_viewer.Get_Slot(Am_TEXT);
  prev_bits = slot.Get_Demon_Bits();
  slot.Set_Demon_Bits(rich_text_demon_bit | prev_bits);

  // Set the demon mask
  unsigned short mask = obj_adv_viewer.Get_Demon_Mask();
  mask |= rich_text_demon_bit;
  obj_adv_viewer.Set_Demon_Mask(mask);

  // Set the initial values now that the demon procedures are installed
  Am_Text_Viewer.Set(Am_TOP, 0)
      .Set(Am_LEFT, 0)
      .Set(Am_WIDTH, 200)
      .Set(Am_HEIGHT, 200)
      .Set(Am_DRAW_METHOD, draw_rich_text)
      .Add(Am_TEXT, Am_No_Rich_Text) // should be a Am_Rich_Text object
      .Add(Am_TEXT_VIEWER, Am_Text_Viewing_Context());
}